

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *this,void **vtt
          )

{
  TPZManVector<TPZEqnArray<float>_*,_10> *in_RSI;
  TPZStack<TPZEqnArray<float>_*,_10> *in_RDI;
  TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *unaff_retaddr;
  int64_t in_stack_ffffffffffffffe8;
  TPZManVector<TPZEqnArray<float>_*,_10> *this_00;
  
  this_00 = in_RSI;
  TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::TPZFrontMatrix
            (unaff_retaddr,(void **)in_RDI);
  (in_RDI->super_TPZManVector<TPZEqnArray<float>_*,_10>).super_TPZVec<TPZEqnArray<float>_*>.
  _vptr_TPZVec = (in_RSI->super_TPZVec<TPZEqnArray<float>_*>)._vptr_TPZVec;
  TPZStack<TPZEqnArray<float>_*,_10>::TPZStack(in_RDI);
  *(undefined4 *)(in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc + 4) = 0;
  in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc[7] =
       (TPZEqnArray<float> *)0x0;
  in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc[8] =
       (TPZEqnArray<float> *)0x0;
  in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc[5] =
       (TPZEqnArray<float> *)0x0;
  in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc[6] =
       (TPZEqnArray<float> *)0x0;
  in_RDI[0x323].super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc[9] =
       (TPZEqnArray<float> *)0x0;
  std::mutex::mutex((mutex *)0x1d35dc8);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x324));
  TPZManVector<TPZEqnArray<float>_*,_10>::Resize(this_00,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}